

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGetRuntimeDependenciesGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallGetRuntimeDependenciesGenerator::GenerateScript
          (cmInstallGetRuntimeDependenciesGenerator *this,ostream *os)

{
  __type _Var1;
  ostream *poVar2;
  string sStack_68;
  string local_48;
  
  poVar2 = ::operator<<(os,(cmScriptGeneratorIndent)0x0);
  std::operator<<(poVar2,"if(");
  if ((this->FrameworkComponent)._M_string_length != 0) {
    _Var1 = std::operator==(&this->FrameworkComponent,&this->LibraryComponent);
    if (!_Var1) {
      cmInstallGenerator::CreateComponentTest
                (&sStack_68,&this->super_cmInstallGenerator,&this->LibraryComponent,true,false);
      poVar2 = std::operator<<(os,(string *)&sStack_68);
      poVar2 = std::operator<<(poVar2," OR ");
      cmInstallGenerator::CreateComponentTest
                (&local_48,&this->super_cmInstallGenerator,&this->FrameworkComponent,
                 (this->super_cmInstallGenerator).ExcludeFromAll,false);
      std::operator<<(poVar2,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      goto LAB_0037de7c;
    }
  }
  cmInstallGenerator::CreateComponentTest
            (&sStack_68,&this->super_cmInstallGenerator,&this->LibraryComponent,
             (this->super_cmInstallGenerator).ExcludeFromAll,false);
  std::operator<<(os,(string *)&sStack_68);
LAB_0037de7c:
  std::__cxx11::string::~string((string *)&sStack_68);
  std::operator<<(os,")\n");
  (*(this->super_cmInstallGenerator).super_cmScriptGenerator._vptr_cmScriptGenerator[3])(this,os,2);
  poVar2 = ::operator<<(os,(cmScriptGeneratorIndent)0x0);
  std::operator<<(poVar2,"endif()\n\n");
  return;
}

Assistant:

void cmInstallGetRuntimeDependenciesGenerator::GenerateScript(std::ostream& os)
{
  // Track indentation.
  Indent indent;

  // Begin this block of installation.
  os << indent << "if(";
  if (this->FrameworkComponent.empty() ||
      this->FrameworkComponent == this->LibraryComponent) {
    os << this->CreateComponentTest(this->LibraryComponent,
                                    this->ExcludeFromAll);
  } else {
    os << this->CreateComponentTest(this->LibraryComponent, true) << " OR "
       << this->CreateComponentTest(this->FrameworkComponent,
                                    this->ExcludeFromAll);
  }
  os << ")\n";

  // Generate the script possibly with per-configuration code.
  this->GenerateScriptConfigs(os, indent.Next());

  // End this block of installation.
  os << indent << "endif()\n\n";
}